

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::
     visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
               (string_view full_tag,string_view tag,CountingVisitor *visitor,
               basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *istream,
               int max_recursion)

{
  char __rhs;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  runtime_error *prVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  string_view sVar10;
  string_view y_00;
  bool y;
  size_t local_b0;
  char local_a5 [13];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  uint32_t size;
  string_view local_70;
  string_view full_tag_local;
  string local_50;
  
  uVar6 = tag._len;
  _y = tag._ptr;
  full_tag_local._len = full_tag._len;
  full_tag_local._ptr = full_tag._ptr;
  if (max_recursion == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_view::to_string_abi_cxx11_((string *)&size,&full_tag_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                   "Recursion limit exceeded while visiting tag: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size);
    std::runtime_error::runtime_error(prVar5,(string *)&y);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar6 == 0) {
    return;
  }
  __rhs = *_y;
  if (__rhs == '(') {
    local_b0 = 0;
    if (uVar6 != 1) {
      local_b0 = uVar6 - 2;
    }
    _y = _y + 1;
    visitor->_count = visitor->_count + 1;
    while (sVar10 = tag_pop((string_view *)&y), sVar10._len != 0) {
      visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                (full_tag,sVar10,visitor,istream,max_recursion + -1);
    }
LAB_0013c827:
    visitor->_count = visitor->_count + 1;
    return;
  }
  if (__rhs == '/') {
    local_70._ptr = _y + 1;
    local_70._len = 0;
    if (uVar6 != 1) {
      local_70._len = uVar6 - 2;
    }
    if (uVar6 < 3) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      string_view::to_string_abi_cxx11_(&local_50,&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                     "Invalid enum tag: \'",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,"\'"
                    );
      std::runtime_error::runtime_error(prVar5,(string *)&y);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a5._5_8_ = local_a5;
    visit_arithmetic<mserialize::detail::IntegerToHex,std::__cxx11::stringstream>
              (*local_70._ptr,(IntegerToHex *)&y,istream);
    uVar6 = 2;
    if (local_70._len < 2) {
      uVar6 = local_70._len;
    }
    local_70._ptr = local_70._ptr + uVar6;
    local_70._len = local_70._len - uVar6;
    remove_prefix_before(&local_70,'\'');
    uVar1 = local_a5._5_8_;
    *(char *)(local_a5._5_8_ + -1) = '\'';
    sVar10._ptr = (char *)(uVar1 + -1);
    local_a5[0] = '`';
    pcVar9 = local_a5 + (1 - (long)sVar10._ptr);
    sVar10._len = (size_t)pcVar9;
    sVar3 = string_view::find(&local_70,sVar10,0);
    if (sVar3 != 0xffffffffffffffff) {
      pcVar4 = pcVar9 + (sVar3 - 1);
      if (local_70._len < pcVar9 + (sVar3 - 1)) {
        pcVar4 = (char *)local_70._len;
      }
      local_70._ptr = local_70._ptr + (long)pcVar4;
      local_70._len = local_70._len - (long)pcVar4;
      tag_pop_label(&local_70);
    }
    goto LAB_0013c827;
  }
  local_98 = istream;
  if (__rhs == '<') {
    local_b0 = 0;
    if (uVar6 != 1) {
      local_b0 = uVar6 - 2;
    }
    _y = _y + 1;
    TrivialDeserializer<unsigned_char>::deserialize<std::__cxx11::stringstream>
              ((uchar *)&size,istream);
    while (bVar2 = (char)size != '\0', size._0_1_ = (char)size + -1, bVar2) {
      tag_pop((string_view *)&y);
    }
    sVar10 = tag_pop((string_view *)&y);
    visitor->_count = visitor->_count + 1;
    y_00._len = 1;
    y_00._ptr = "0";
    bVar2 = mserialize::operator==(sVar10,y_00);
    if (bVar2) {
LAB_0013c930:
      iVar8 = visitor->_count + 1;
      visitor->_count = iVar8;
      goto LAB_0013ca0d;
    }
    visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
              (full_tag,sVar10,visitor,local_98,max_recursion + -1);
  }
  else {
    if (__rhs == '{') {
      local_b0 = uVar6 - 1;
      sVar10 = remove_prefix_before((string_view *)&y,'`');
      if (local_b0 == 0) {
        _y = resolve_recursive_tag(full_tag,sVar10);
      }
      sVar7 = local_b0;
      while( true ) {
        iVar8 = visitor->_count;
        visitor->_count = iVar8 + 1;
        if (sVar7 == 0) break;
        tag_pop_label((string_view *)&y);
        sVar10 = tag_pop((string_view *)&y);
        visitor->_count = visitor->_count + 1;
        visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                  (full_tag,sVar10,visitor,istream,max_recursion + -1);
        sVar7 = local_b0;
      }
      visitor->_count = iVar8 + 2;
      return;
    }
    if (__rhs != '[') {
      switch(__rhs) {
      case 'b':
        TrivialDeserializer<signed_char>::deserialize<std::__cxx11::stringstream>(&y,istream);
        break;
      case 'c':
        TrivialDeserializer<char>::deserialize<std::__cxx11::stringstream>(&y,istream);
        break;
      case 'd':
        TrivialDeserializer<double>::deserialize<std::__cxx11::stringstream>((double *)&y,istream);
        break;
      case 'e':
      case 'g':
      case 'h':
      case 'j':
      case 'k':
switchD_0013ca31_caseD_65:
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&size,"Invalid arithmetic tag: ",(allocator *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                       __rhs);
        std::runtime_error::runtime_error(prVar5,(string *)&y);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 'f':
        TrivialDeserializer<float>::deserialize<std::__cxx11::stringstream>((float *)&y,istream);
        break;
      case 'i':
        TrivialDeserializer<int>::deserialize<std::__cxx11::stringstream>((int *)&y,istream);
        break;
      case 'l':
        TrivialDeserializer<long>::deserialize<std::__cxx11::stringstream>((long *)&y,istream);
        break;
      default:
        if (__rhs == 'B') {
          TrivialDeserializer<unsigned_char>::deserialize<std::__cxx11::stringstream>(&y,istream);
        }
        else if (__rhs == 'D') {
          TrivialDeserializer<long_double>::deserialize<std::__cxx11::stringstream>
                    ((longdouble *)&y,istream);
        }
        else if (__rhs == 'I') {
          TrivialDeserializer<unsigned_int>::deserialize<std::__cxx11::stringstream>
                    ((uint *)&y,istream);
        }
        else if (__rhs == 'L') {
          TrivialDeserializer<unsigned_long>::deserialize<std::__cxx11::stringstream>
                    ((unsigned_long *)&y,istream);
        }
        else if (__rhs == 'S') {
          TrivialDeserializer<unsigned_short>::deserialize<std::__cxx11::stringstream>
                    ((unsigned_short *)&y,istream);
        }
        else if (__rhs == 's') {
          TrivialDeserializer<short>::deserialize<std::__cxx11::stringstream>((short *)&y,istream);
        }
        else {
          if (__rhs != 'y') goto switchD_0013ca31_caseD_65;
          TrivialDeserializer<bool>::deserialize<std::__cxx11::stringstream>(&y,istream);
        }
      }
      goto LAB_0013c827;
    }
    iVar8 = max_recursion + -1;
    local_b0 = uVar6 - 1;
    _y = _y + 1;
    TrivialDeserializer<unsigned_int>::deserialize<std::__cxx11::stringstream>(&size,istream);
    sVar10 = tag_pop((string_view *)&y);
    visitor->_count = visitor->_count + 1;
    if ((0x20 < size) && (bVar2 = singular_impl(full_tag,sVar10,iVar8), bVar2)) {
      visitor->_count = visitor->_count + 1;
      visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                (full_tag,sVar10,visitor,local_98,iVar8);
      goto LAB_0013c930;
    }
    while (bVar2 = size != 0, size = size - 1, bVar2) {
      visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                (full_tag,sVar10,visitor,local_98,iVar8);
    }
  }
  iVar8 = visitor->_count;
LAB_0013ca0d:
  visitor->_count = iVar8 + 1;
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}